

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::nextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  Mark *pMVar3;
  runtime_error *this_00;
  allocator<char> local_79;
  undefined1 local_78 [24];
  undefined1 local_60 [16];
  __index_type local_50;
  Mark local_48;
  string local_40;
  
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 != -1) {
    do {
      do {
        bVar2 = tryToSkipSpaces(this);
      } while (bVar2);
      bVar2 = tryToSkipComments(this);
    } while (bVar2);
    bVar2 = tryToGetKeywordOrIdentifier(this);
    if (bVar2) goto LAB_0014dcf1;
    bVar2 = tryToGetString(this);
    if (bVar2) goto LAB_0014dcf1;
    bVar2 = tryToGetNumber(this);
    if (bVar2) goto LAB_0014dcf1;
    bVar2 = tryToGetSingleCharToken(this);
    if (bVar2) goto LAB_0014dcf1;
    bVar2 = tryToGetCompoundToken(this);
    if (bVar2) goto LAB_0014dcf1;
    cVar1 = Stream::peek(&this->stream_);
    if (cVar1 != -1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Unexpected character!",&local_79);
      makeErrorMessage((string *)local_78,this,&local_40);
      std::runtime_error::runtime_error(this_00,(string *)local_78);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pMVar3 = Stream::getMark(&this->stream_);
  local_78._0_4_ = EOT;
  local_78._8_8_ = local_60;
  local_78._16_8_ = 0;
  local_60[0] = '\0';
  local_50 = '\0';
  local_48 = *pMVar3;
  Token::operator=(&this->token_,(Token *)local_78);
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)(local_78 + 8));
LAB_0014dcf1:
  Token::Token(__return_storage_ptr__,&this->token_);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::nextToken()
{
  if(stream_.peek() != EOF)
  {
    while(tryToSkipSpaces() || tryToSkipComments());

    if(tryToGetKeywordOrIdentifier())
      return token_;
    else if(tryToGetString())
      return token_;
    else if(tryToGetNumber())
      return token_;
    else if(tryToGetSingleCharToken())
      return token_;
    else if(tryToGetCompoundToken())
      return token_;
    else if(stream_.peek() == EOF)
      token_ = Token{stream_.getMark()};
    else
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    token_ = Token{stream_.getMark()};

  return token_;
}